

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::
Maybe<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
::Maybe(Maybe<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
        *this,Maybe<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
              *other)

{
  kj::_::
  NullableValue<kj::_::Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>_>
  ::NullableValue(&this->ptr,&other->ptr);
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    kj::_::
    Tuple<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>,_kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool,_kj::Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_>
    ::~Tuple(&(other->ptr).field_1.value);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }